

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O2

void __thiscall
powerpc_test_cpu::test_instruction_CRI__(powerpc_test_cpu *this,char *insn,uint32_t opcode)

{
  uint a2;
  uint32_t a1;
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  if (test_instruction_CRI__(char_const*,unsigned_int)::code == '\0') {
    iVar1 = __cxa_guard_acquire(&test_instruction_CRI__(char_const*,unsigned_int)::code);
    if (iVar1 != 0) {
      test_instruction_CRI__::code[0] = 0;
      test_instruction_CRI__::code[1] = 0x4e800020;
      test_instruction_CRI__::code[2] = 0x7c802378;
      test_instruction_CRI__::code[3] = 0;
      test_instruction_CRI__::code[4] = 0x4e800020;
      __cxa_guard_release(&test_instruction_CRI__(char_const*,unsigned_int)::code);
    }
  }
  for (iVar1 = 0; iVar1 != 8; iVar1 = iVar1 + 1) {
    opcode = opcode & 0xfc7fffff | iVar1 << 0x17;
    for (lVar3 = 0; lVar3 != 0x24; lVar3 = lVar3 + 1) {
      a2 = imm_values[lVar3];
      uVar2 = a2 & 0xffff | opcode & 0xffff0000;
      test_instruction_CRI__::code[3] = a2 & 0xffff | opcode & 0xffe00000;
      test_instruction_CRI__::code[0] = uVar2;
      for (lVar4 = 0; lVar4 != 0x90; lVar4 = lVar4 + 4) {
        a1 = *(uint32_t *)((long)reg_values + lVar4);
        test_one(this,test_instruction_CRI__::code,insn,a1,a2,0,0);
        test_one(this,test_instruction_CRI__::code + 2,insn,a1,a2,0,0);
      }
      opcode = uVar2;
    }
  }
  return;
}

Assistant:

void powerpc_test_cpu::test_instruction_CRI__(const char *insn, uint32_t opcode)
{
	// Test code
	static uint32_t code[] = {
		POWERPC_ILLEGAL, POWERPC_BLR,
		POWERPC_MR(0, RA), POWERPC_ILLEGAL, POWERPC_BLR
	};

	// Input values
	const int n_reg_values = sizeof(reg_values)/sizeof(reg_values[0]);
	const int n_imm_values = sizeof(imm_values)/sizeof(imm_values[0]);

	for (int k = 0; k < 8; k++) {
		crfD_field::insert(opcode, k);
		for (int j = 0; j < n_imm_values; j++) {
			const uint32_t im = imm_values[j];
			UIMM_field::insert(opcode, im);
			code[0] = code[3] = opcode;			// <op> crfD,RA,SIMM
			rA_field::insert(code[3], 0);		// <op> crfD,R0,SIMM
			flush_icache_range(code, sizeof(code));
			for (int i = 0; i < n_reg_values; i++) {
				const uint32_t ra = reg_values[i];
				test_one(&code[0], insn, ra, im, 0);
				test_one(&code[2], insn, ra, im, 0);
			}
		}
	}
}